

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

void __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::convertTextData<char>
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this,char *source,char *pointerToStore
          ,int sizeWithoutHeader)

{
  unsigned_short *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar2 = 0xffffffffffffffff;
  if (-1 < sizeWithoutHeader) {
    uVar2 = (ulong)(uint)sizeWithoutHeader * 2;
  }
  uVar4 = 0;
  if (0 < sizeWithoutHeader) {
    uVar4 = (ulong)(uint)sizeWithoutHeader;
  }
  puVar1 = (unsigned_short *)operator_new__(uVar2);
  this->TextData = puVar1;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    this->TextData[uVar3] = (short)source[uVar3];
  }
  this->TextBegin = this->TextData;
  this->TextSize = sizeWithoutHeader;
  if (pointerToStore != (char *)0x0) {
    operator_delete__(pointerToStore);
    return;
  }
  return;
}

Assistant:

void convertTextData(src_char_type* source, char* pointerToStore, int sizeWithoutHeader)
	{
		// convert little to big endian if necessary
		if (sizeof(src_char_type) > 1 && 
			isLittleEndian(TargetFormat) != isLittleEndian(SourceFormat))
			convertToLittleEndian(source);

		// check if conversion is necessary:
		if (sizeof(src_char_type) == sizeof(char_type))
		{
			// no need to convert
			TextBegin = (char_type*)source;
			TextData = (char_type*)pointerToStore;
			TextSize = sizeWithoutHeader;
		}
		else
		{
			// convert source into target data format. 
			// TODO: implement a real conversion. This one just 
			// copies bytes. This is a problem when there are 
			// unicode symbols using more than one character.

			TextData = new char_type[sizeWithoutHeader];

			// MSVC debugger complains here about loss of data ...
			size_t numShift = sizeof( char_type) * 8;
			assert(numShift < 64);
			const src_char_type cc = (src_char_type)(((uint64_t(1u) << numShift) - 1));
			for (int i=0; i<sizeWithoutHeader; ++i)
				TextData[i] = char_type( source[i] & cc); 

			TextBegin = TextData;
			TextSize = sizeWithoutHeader;

			// delete original data because no longer needed
			delete [] pointerToStore;
		}
	}